

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fill<kj::StringPtr,kj::CappedArray<char,8ul>>
                 (char *target,StringPtr *first,CappedArray<char,_8UL> *rest)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (first->content).ptr;
  sVar1 = (first->content).size_;
  for (lVar3 = 0; sVar1 - 1 != lVar3; lVar3 = lVar3 + 1) {
    target[lVar3] = pcVar2[lVar3];
  }
  pcVar2 = fill<kj::CappedArray<char,8ul>>(target + lVar3,rest);
  return pcVar2;
}

Assistant:

inline constexpr const T* begin() const { return ptr; }